

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall ON_Font::Write(ON_Font *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uchar quartet_member_as_unsigned;
  ON_wString obsolete_font_description;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if ((iVar3 < 0x3c) ||
     (uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file),
     uVar4 < ON_TextStyle::binary_archive_opennurbs_version)) {
    ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                 ,0x2906,"","This font should probably be an ON_TextStyle.");
    bVar1 = WriteV5(this,this->m_runtime_serial_number,(ON_UUID)ZEXT816((ulong)0),file);
    return bVar1;
  }
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,6);
  if (!bVar1) {
    return false;
  }
  uVar4 = FontCharacteristicsAsUnsigned(this);
  bVar1 = ON_BinaryArchive::WriteInt(file,uVar4);
  if (bVar1) {
    WindowsLogfontName((ON_Font *)&obsolete_font_description);
    bVar1 = ON_BinaryArchive::WriteWideString(file,&obsolete_font_description);
    ON_wString::~ON_wString(&obsolete_font_description);
    if (bVar1) {
      PostScriptName((ON_Font *)&obsolete_font_description);
      bVar1 = ON_BinaryArchive::WriteString(file,&obsolete_font_description);
      ON_wString::~ON_wString(&obsolete_font_description);
      if (bVar1) {
        PostScriptName((ON_Font *)&obsolete_font_description);
        bVar1 = ON_wString::IsEmpty(&obsolete_font_description);
        if (bVar1) {
          FamilyName((ON_Font *)&quartet_member_as_unsigned);
          ON_wString::operator=
                    (&obsolete_font_description,(ON_wString *)&quartet_member_as_unsigned);
          ON_wString::~ON_wString((ON_wString *)&quartet_member_as_unsigned);
        }
        bVar1 = ON_wString::IsEmpty(&obsolete_font_description);
        if (bVar1) {
          WindowsLogfontName((ON_Font *)&quartet_member_as_unsigned);
          ON_wString::operator=
                    (&obsolete_font_description,(ON_wString *)&quartet_member_as_unsigned);
          ON_wString::~ON_wString((ON_wString *)&quartet_member_as_unsigned);
        }
        bVar1 = ON_BinaryArchive::WriteString(file,&obsolete_font_description);
        if ((((bVar1) &&
             (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_windows_logfont_weight), bVar1)) &&
            (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_apple_font_weight_trait), bVar1)) &&
           ((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_point_size), bVar1 &&
            (bVar1 = ON_BinaryArchive::WriteBool(file,false), bVar1)))) {
          FamilyName((ON_Font *)&quartet_member_as_unsigned);
          bVar1 = ON_BinaryArchive::WriteString(file,(ON_wString *)&quartet_member_as_unsigned);
          ON_wString::~ON_wString((ON_wString *)&quartet_member_as_unsigned);
          if ((((!bVar1) ||
               ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_locale_name), !bVar1 ||
                (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_loc_postscript_name), !bVar1)))
               ) || ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_en_postscript_name),
                     !bVar1 || ((((bVar1 = ON_BinaryArchive::WriteString
                                                     (file,&this->m_loc_windows_logfont_name),
                                  !bVar1 || (bVar1 = ON_BinaryArchive::WriteString
                                                               (file,&this->
                                                  m_en_windows_logfont_name), !bVar1)) ||
                                 (bVar1 = ON_BinaryArchive::WriteString
                                                    (file,&this->m_loc_family_name), !bVar1)) ||
                                ((bVar1 = ON_BinaryArchive::WriteString
                                                    (file,&this->m_en_family_name), !bVar1 ||
                                 (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_loc_face_name)
                                 , !bVar1)))))))) ||
             ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_en_face_name), !bVar1 ||
              (bVar1 = ON_PANOSE1::Write(&this->m_panose1,file), !bVar1)))) goto LAB_004a5bbb;
          quartet_member_as_unsigned = this->m_quartet_member;
          bVar1 = ON_BinaryArchive::WriteByte(file,1,&quartet_member_as_unsigned);
        }
        else {
LAB_004a5bbb:
          bVar1 = false;
        }
        ON_wString::~ON_wString(&obsolete_font_description);
        goto LAB_004a5ba5;
      }
    }
  }
  bVar1 = false;
LAB_004a5ba5:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_Font::Write(
  ON_BinaryArchive& file // serialize definition to binary archive
  ) const
{

  if (file.Archive3dmVersion() < 60 
    || file.ArchiveOpenNURBSVersion() < ON_TextStyle::binary_archive_opennurbs_version
    )
  {
    ON_WARNING("This font should probably be an ON_TextStyle.");
    return WriteV5(
      RuntimeSerialNumber(),
      ON_nil_uuid,
      file
      );
  }


  if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,6))
    return false;

  bool rc = false;
  for (;;)
  {
    // version 1.0
    unsigned int fc = FontCharacteristicsAsUnsigned();
    if (!file.WriteInt(fc))
      break;

    // Windows LOGFONT.lfFaceName
    if ( !file.WriteWideString(WindowsLogfontName()) )
      break;

    // PostScript name
    if (!file.WriteString(PostScriptName()))
      break;

    // version 1.1 added font_description August 2016
    ON_wString obsolete_font_description = PostScriptName();
    if (obsolete_font_description.IsEmpty())
      obsolete_font_description = FamilyName();
    if (obsolete_font_description.IsEmpty())
      obsolete_font_description = WindowsLogfontName();
    if (!file.WriteString(obsolete_font_description))
      break;

    // version 1.2 added m_windows_logfont_weight and m_apple_font_weight_trait
    if (!file.WriteInt(m_windows_logfont_weight))
      break;

    if (!file.WriteDouble(m_apple_font_weight_trait))
      break;

    // version 1.3 added additional m_point_size and m_LOGFONT_* values.
    if (!file.WriteDouble(m_point_size))
      break;

    const bool bOBSOLETEBool = false;
    if (!file.WriteBool(bOBSOLETEBool))
      break;
    
    // version 1.4 explicit Family name
    if (!file.WriteString(FamilyName()))
      break;

    // version 1.5 explicit names in loc and en and PANOSE1 settings
    if (!file.WriteString(m_locale_name))
      break;

    bool bFontNamesSaved = false;
    for(;;)
    {
      // NEVER commit code with this define set.
      //
      // This code is used by developers to create files used to test
      // code and UI for handing situations when a font is not installed
      // on a device.
      //
      // To create a missing font test .3dm file, you must modify code 
      // int opennurbs_font.cpp and in opennurbs_text.cpp. 
      // Search for CREATE_MISSING_FONT_TEST_3DM_FILE to find the locations.
//#define CREATE_MISSING_FONT_TEST_3DM_FILE
#if defined(CREATE_MISSING_FONT_TEST_3DM_FILE)
      // All fonts in the Family with MISSING_FONT_TEST_valid_family_name 
      // will be saved as a family named missing_family_name.
      const ON_wString MISSING_FONT_TEST_valid_font_family_name(L"Courier New");
      if (MISSING_FONT_TEST_valid_font_family_name == FamilyName() && FaceName().IsNotEmpty())
      {
        // Write Missing Font names
        const ON_wString missing_font_family_name(L"Missing Font Test");
        const ON_wString missing_font_face_name(FaceName());
        const ON_wString missing_font_logfont_name(missing_font_family_name);
        ON_wString missing_font_postscript_name = missing_font_family_name + L"-" + missing_font_face_name;
        missing_font_postscript_name.Remove(ON_wString::Space);
        // local and english postscript name
        if (!file.WriteString(missing_font_postscript_name))
          break;
        if (!file.WriteString(missing_font_postscript_name))
          break;
        // local and english logfont name
        if (!file.WriteString(missing_font_logfont_name))
          break;
        if (!file.WriteString(missing_font_logfont_name))
          break;
        // local and english family name
        if (!file.WriteString(missing_font_family_name))
          break;
        if (!file.WriteString(missing_font_family_name))
          break;
        // local and english face name
        if (!file.WriteString(missing_font_face_name))
          break;
        if (!file.WriteString(missing_font_face_name))
          break;

        bFontNamesSaved = true;
        break;
      }
#endif

      // write correct names
      if (!file.WriteString(m_loc_postscript_name))
        break;
      if (!file.WriteString(m_en_postscript_name))
        break;
      if (!file.WriteString(m_loc_windows_logfont_name))
        break;
      if (!file.WriteString(m_en_windows_logfont_name))
        break;
      if (!file.WriteString(m_loc_family_name))
        break;
      if (!file.WriteString(m_en_family_name))
        break;
      if (!file.WriteString(m_loc_face_name))
        break;
      if (!file.WriteString(m_en_face_name))
        break;

      bFontNamesSaved = true;
      break;
    }

    if (false == bFontNamesSaved)
      break; // errors writing font names


    if (!m_panose1.Write(file))
      break;

    // version 1.6 rich text quartet member (regular/bold/italic/bold-italic)
    const unsigned char quartet_member_as_unsigned = static_cast<unsigned char>(this->m_quartet_member);
    if (!file.WriteByte(1,&quartet_member_as_unsigned))
      break;

    rc = true;
    break;
  }

  if (!file.EndWrite3dmChunk())
    rc = false;

  return rc;
}